

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# musashi_softfloat.c
# Opt level: O3

float64 float64_add(float64 a,float64 b)

{
  float64 fVar1;
  ulong uVar2;
  ushort uVar3;
  ulong uVar4;
  byte zSign;
  ushort uVar5;
  ulong uVar6;
  bits64 zSig;
  uint uVar7;
  ushort uVar8;
  uint uVar9;
  
  zSign = (byte)(a >> 0x3f);
  if (a >> 0x3f == b >> 0x3f) {
    fVar1 = addFloat64Sigs(a,b,zSign);
    return fVar1;
  }
  uVar7 = (uint)(a >> 0x34) & 0x7ff;
  uVar9 = (uint)(b >> 0x34) & 0x7ff;
  uVar6 = (a & 0xfffffffffffff) << 10;
  uVar2 = (b & 0xfffffffffffff) << 10;
  uVar5 = (ushort)uVar7;
  uVar8 = (ushort)uVar9;
  uVar3 = uVar5 - uVar8;
  if (uVar3 == 0 || uVar5 < uVar8) {
    if ((short)uVar3 < 0) {
      if (uVar9 == 0x7ff) {
        if ((b & 0xfffffffffffff) == 0) {
          return (ulong)(byte)~zSign << 0x3f | 0x7ff0000000000000;
        }
        goto LAB_00466dad;
      }
      uVar4 = uVar6 | 0x4000000000000000;
      if (uVar5 == 0) {
        uVar4 = uVar6;
      }
      uVar5 = -uVar3 - (ushort)(uVar5 == 0);
      if (uVar5 != 0) {
        if (uVar5 < 0x40) {
          uVar4 = (ulong)(uVar4 << (-(byte)uVar5 & 0x3f) != 0) | uVar4 >> ((byte)uVar5 & 0x3f);
        }
        else {
          uVar4 = (ulong)(uVar4 != 0);
        }
      }
      uVar2 = uVar2 | 0x4000000000000000;
      uVar5 = uVar8;
    }
    else {
      if (uVar5 == 0) {
        uVar5 = 1;
        uVar8 = 1;
      }
      else if (uVar7 == 0x7ff) {
        if (((b | a) & 0xfffffffffffff) == 0) {
          float_exception_flags = float_exception_flags | 1;
          return 0xffffffffffffffff;
        }
        goto LAB_00466dad;
      }
      if (uVar2 < uVar6) goto LAB_00466e50;
      uVar4 = uVar6;
      uVar5 = uVar8;
      if (uVar2 <= uVar6) {
        return (ulong)(float_rounding_mode == '\x02') << 0x3f;
      }
    }
    zSig = uVar2 - uVar4;
    zSign = zSign ^ 1;
  }
  else {
    if (uVar7 == 0x7ff) {
      if ((a & 0xfffffffffffff) == 0) {
        return a;
      }
LAB_00466dad:
      fVar1 = propagateFloat64NaN(a,b);
      return fVar1;
    }
    if (uVar8 == 0) {
      uVar3 = uVar3 - 1;
      if (uVar3 != 0) goto LAB_00466e24;
    }
    else {
      uVar2 = uVar2 | 0x4000000000000000;
LAB_00466e24:
      if (uVar3 < 0x40) {
        uVar2 = (ulong)(uVar2 << (-(byte)uVar3 & 0x3f) != 0) | uVar2 >> ((byte)uVar3 & 0x3f);
      }
      else {
        uVar2 = (ulong)(uVar2 != 0);
      }
    }
    uVar6 = uVar6 | 0x4000000000000000;
LAB_00466e50:
    zSig = uVar6 - uVar2;
  }
  fVar1 = normalizeRoundAndPackFloat64(zSign,uVar5 - 1,zSig);
  return fVar1;
}

Assistant:

float64 float64_add( float64 a, float64 b )
{
	flag aSign, bSign;

	aSign = extractFloat64Sign( a );
	bSign = extractFloat64Sign( b );
	if ( aSign == bSign ) {
		return addFloat64Sigs( a, b, aSign );
	}
	else {
		return subFloat64Sigs( a, b, aSign );
	}

}